

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
RegisterPlanTestPoolWithDepthOne::RegisterPlanTestPoolWithDepthOne
          (RegisterPlanTestPoolWithDepthOne *this)

{
  RegisterTest(PlanTestPoolWithDepthOne::Create,"PlanTest.PoolWithDepthOne");
  return;
}

Assistant:

TEST_F(PlanTest, PoolWithDepthOne) {
  TestPoolWithDepthOne(
"pool foobar\n"
"  depth = 1\n"
"rule poolcat\n"
"  command = cat $in > $out\n"
"  pool = foobar\n"
"build out1: poolcat in\n"
"build out2: poolcat in\n");
}